

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# busyindicator.cpp
# Opt level: O0

void __thiscall QtMWidgets::BusyIndicator::paintEvent(BusyIndicator *this,QPaintEvent *param_1)

{
  int iVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  BusyIndicatorPrivate *pBVar5;
  QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
  *pQVar6;
  QBrush local_d8 [8];
  QColor local_d0;
  QColor local_c0;
  QVariant local_b0;
  QConicalGradient local_90 [8];
  QConicalGradient gradient;
  QPainterPath local_38 [8];
  QPainterPath path;
  QPainter local_20 [8];
  QPainter p;
  QPaintEvent *param_1_local;
  BusyIndicator *this_local;
  
  _p = param_1;
  QPainter::QPainter(local_20,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)local_20,true);
  iVar3 = QWidget::width(&this->super_QWidget);
  iVar4 = QWidget::height(&this->super_QWidget);
  QPainter::translate(local_20,(double)(iVar3 / 2),(double)(iVar4 / 2));
  QPainterPath::QPainterPath(local_38);
  QPainterPath::setFillRule((FillRule)local_38);
  pQVar6 = &this->d;
  pBVar5 = QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
           ::operator->(pQVar6);
  iVar3 = pBVar5->outerRadius;
  pBVar5 = QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
           ::operator->(pQVar6);
  iVar4 = pBVar5->outerRadius;
  pBVar5 = QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
           ::operator->(pQVar6);
  iVar1 = pBVar5->outerRadius;
  pBVar5 = QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
           ::operator->(pQVar6);
  QPainterPath::addEllipse
            (local_38,(double)-iVar3,(double)-iVar4,(double)(iVar1 * 2),
             (double)(pBVar5->outerRadius * 2));
  pQVar6 = &this->d;
  pBVar5 = QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
           ::operator->(pQVar6);
  iVar3 = pBVar5->innerRadius;
  pBVar5 = QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
           ::operator->(pQVar6);
  iVar4 = pBVar5->innerRadius;
  pBVar5 = QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
           ::operator->(pQVar6);
  iVar1 = pBVar5->innerRadius;
  pBVar5 = QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
           ::operator->(pQVar6);
  QPainterPath::addEllipse
            (local_38,(double)-iVar3,(double)-iVar4,(double)(iVar1 * 2),
             (double)(pBVar5->innerRadius * 2));
  QPainter::setPen((PenStyle)local_20);
  QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
  ::operator->(&this->d);
  QVariantAnimation::currentValue();
  dVar2 = (double)QVariant::toReal((bool *)&local_b0);
  QConicalGradient::QConicalGradient(local_90,0.0,0.0,-dVar2);
  QVariant::~QVariant(&local_b0);
  QColor::QColor(&local_c0,transparent);
  QGradient::setColorAt(0.0,(QColor *)local_90);
  QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
  ::operator->(&this->d);
  QGradient::setColorAt(0.05,(QColor *)local_90);
  QColor::QColor(&local_d0,transparent);
  QGradient::setColorAt(1.0,(QColor *)local_90);
  QBrush::QBrush(local_d8,(QGradient *)local_90);
  QPainter::setBrush((QBrush *)local_20);
  QBrush::~QBrush(local_d8);
  QPainter::drawPath((QPainterPath *)local_20);
  QConicalGradient::~QConicalGradient(local_90);
  QPainterPath::~QPainterPath(local_38);
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void
BusyIndicator::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );
	p.translate( width() / 2, height() / 2 );

	QPainterPath path;
	path.setFillRule( Qt::OddEvenFill );
	path.addEllipse( - d->outerRadius, - d->outerRadius,
		d->outerRadius * 2, d->outerRadius * 2 );
	path.addEllipse( - d->innerRadius, - d->innerRadius,
		d->innerRadius * 2, d->innerRadius * 2 );

	p.setPen( Qt::NoPen );

	QConicalGradient gradient( 0, 0, - d->animation->currentValue().toReal() );
	gradient.setColorAt( 0.0, Qt::transparent );
	gradient.setColorAt( 0.05, d->color );
	gradient.setColorAt( 1.0, Qt::transparent );

	p.setBrush( gradient );

	p.drawPath( path );
}